

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall ncnn::Net::load_param_bin(Net *this,DataReader *dr)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar1;
  int iVar2;
  pointer pBVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Layer *pLVar5;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  int j;
  char *pcVar6;
  ulong uVar7;
  int j_1;
  int *piVar8;
  long lVar9;
  long lVar10;
  size_t sStack_120;
  int top_count;
  int bottom_count;
  int typeindex;
  int blob_count;
  Layer *local_100;
  int layer_count;
  ulong local_f0;
  Mat local_e8;
  int magic;
  vector<int,_std::allocator<int>_> *local_90;
  ParamDict pd;
  Mat shape_hints;
  
  magic = 0;
  iVar4 = (*dr->_vptr_DataReader[3])(dr,&magic,4);
  if (CONCAT44(extraout_var,iVar4) == 4) {
    if (magic == 0x7685dd) {
      layer_count = 0;
      blob_count = 0;
      iVar4 = (*dr->_vptr_DataReader[3])(dr,&layer_count,4);
      if (CONCAT44(extraout_var_00,iVar4) == 4) {
        iVar4 = (*dr->_vptr_DataReader[3])(dr,&blob_count,4);
        if (CONCAT44(extraout_var_01,iVar4) == 4) {
          if ((0 < (long)layer_count) && (0 < blob_count)) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      (&this->d->layers,(long)layer_count);
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize
                      (&this->d->blobs,(long)blob_count);
            ParamDict::ParamDict(&pd);
            uVar7 = 0;
            do {
              if ((long)layer_count <= (long)uVar7) {
                iVar4 = 0;
                NetPrivate::update_input_output_indexes(this->d);
LAB_001501ce:
                ParamDict::~ParamDict(&pd);
                return iVar4;
              }
              iVar4 = (*dr->_vptr_DataReader[3])(dr,&typeindex,4);
              if (CONCAT44(extraout_var_02,iVar4) != 4) {
                pcVar6 = "read typeindex failed";
LAB_001502ab:
                sStack_120 = 0x15;
LAB_001501aa:
                fwrite(pcVar6,sStack_120,1,_stderr);
                fputc(10,_stderr);
LAB_001501be:
                iVar4 = -1;
                goto LAB_001501ce;
              }
              iVar4 = (*dr->_vptr_DataReader[3])(dr,&bottom_count,4);
              if (CONCAT44(extraout_var_03,iVar4) != 4) {
                pcVar6 = "read bottom_count failed";
                sStack_120 = 0x18;
                goto LAB_001501aa;
              }
              iVar4 = (*dr->_vptr_DataReader[3])(dr,&top_count,4);
              if (CONCAT44(extraout_var_04,iVar4) != 4) {
                pcVar6 = "read top_count failed";
                goto LAB_001502ab;
              }
              local_f0 = uVar7;
              pLVar5 = create_layer(typeindex);
              if (pLVar5 == (Layer *)0x0) {
                iVar4 = (*this->_vptr_Net[4])(this,(ulong)(typeindex & 0xfffffeff));
                pLVar5 = (Layer *)CONCAT44(extraout_var_05,iVar4);
                if (pLVar5 != (Layer *)0x0) goto LAB_0014fd2c;
                fprintf(_stderr,"layer %d not exists or registered",(ulong)(uint)typeindex);
                fputc(10,_stderr);
                clear(this);
                goto LAB_001501be;
              }
LAB_0014fd2c:
              local_90 = &pLVar5->bottoms;
              std::vector<int,_std::allocator<int>_>::resize(local_90,(long)bottom_count);
              uVar7 = local_f0;
              local_100 = pLVar5;
              for (lVar9 = 0; lVar9 < bottom_count; lVar9 = lVar9 + 1) {
                iVar4 = (*dr->_vptr_DataReader[3])(dr,&shape_hints,4);
                if (CONCAT44(extraout_var_06,iVar4) != 4) {
                  pcVar6 = "read bottom_blob_index failed";
                  sStack_120 = 0x1d;
                  goto LAB_001501aa;
                }
                (this->d->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl
                .super__Vector_impl_data._M_start[(int)shape_hints.data].consumer = (int)uVar7;
                (local_90->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar9] = (int)shape_hints.data;
              }
              this_00 = &local_100->tops;
              std::vector<int,_std::allocator<int>_>::resize(this_00,(long)top_count);
              for (lVar9 = 0; lVar9 < top_count; lVar9 = lVar9 + 1) {
                iVar4 = (*dr->_vptr_DataReader[3])(dr,&shape_hints,4);
                if (CONCAT44(extraout_var_07,iVar4) != 4) {
                  pcVar6 = "read top_blob_index failed";
                  sStack_120 = 0x1a;
                  goto LAB_001501aa;
                }
                (this->d->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl
                .super__Vector_impl_data._M_start[(int)shape_hints.data].producer = (int)local_f0;
                (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar9] = (int)shape_hints.data;
              }
              iVar4 = ParamDict::load_param_bin(&pd,dr);
              uVar7 = local_f0;
              if (iVar4 == 0) {
                if (local_100->support_int8_storage == true) {
                  (this->opt).use_vulkan_compute = false;
                }
                local_e8.cstep = 0;
                local_e8.data = (void *)0x0;
                local_e8.refcount._0_4_ = 0;
                local_e8.refcount._4_4_ = 0;
                local_e8.elemsize._0_4_ = 0;
                local_e8.elemsize._4_4_ = 0;
                local_e8.elempack = 0;
                local_e8.h = 0;
                local_e8.d = 0;
                local_e8.c = 0;
                local_e8.allocator = (Allocator *)0x0;
                local_e8.dims = 0;
                local_e8.w = 0;
                ParamDict::get(&shape_hints,&pd,0x1e,&local_e8);
                Mat::~Mat(&local_e8);
                if ((CONCAT44(shape_hints.data._4_4_,(int)shape_hints.data) != 0) &&
                   ((long)shape_hints.c * shape_hints.cstep != 0)) {
                  piVar8 = (int *)(CONCAT44(shape_hints.data._4_4_,(int)shape_hints.data) + 0xc);
                  for (lVar9 = 0; lVar9 < top_count; lVar9 = lVar9 + 1) {
                    iVar4 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar9];
                    pBVar3 = (this->d->blobs).
                             super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    iVar2 = piVar8[-3];
                    if (iVar2 == 3) {
                      local_e8.w = piVar8[-2];
                      local_e8.h = piVar8[-1];
                      local_e8.c = *piVar8;
                      local_e8.data = (void *)0x0;
                      local_e8.refcount._0_4_ = 0;
                      local_e8.refcount._4_4_ = 0;
                      local_e8.elemsize._0_4_ = 4;
                      local_e8.elemsize._4_4_ = 0;
                      local_e8.elempack = 1;
                      local_e8.allocator = (Allocator *)0x0;
                      local_e8.dims = 3;
                      local_e8.cstep = (long)local_e8.h * (long)local_e8.w + 3U & 0x3ffffffffffffffc
                      ;
                      local_e8.d = local_e8.elempack;
                      Mat::operator=(&pBVar3[iVar4].shape,&local_e8);
LAB_0015000b:
                      Mat::~Mat(&local_e8);
                    }
                    else {
                      if (iVar2 == 2) {
                        local_e8.w = piVar8[-2];
                        local_e8.h = piVar8[-1];
                        local_e8.data = (void *)0x0;
                        local_e8.refcount._0_4_ = 0;
                        local_e8.refcount._4_4_ = 0;
                        local_e8.elemsize._0_4_ = 4;
                        local_e8.elemsize._4_4_ = 0;
                        local_e8.elempack = 1;
                        local_e8.allocator = (Allocator *)0x0;
                        local_e8.dims = 2;
                        local_e8.d = 1;
                        local_e8.c = 1;
                        local_e8.cstep = (long)local_e8.h * (long)local_e8.w;
                        Mat::operator=(&pBVar3[iVar4].shape,&local_e8);
                        goto LAB_0015000b;
                      }
                      if (iVar2 == 1) {
                        local_e8.w = piVar8[-2];
                        local_e8.cstep = (size_t)local_e8.w;
                        local_e8.data = (void *)0x0;
                        local_e8.refcount._0_4_ = 0;
                        local_e8.refcount._4_4_ = 0;
                        local_e8.elemsize._0_4_ = 4;
                        local_e8.elemsize._4_4_ = 0;
                        local_e8.elempack = 1;
                        local_e8.allocator = (Allocator *)0x0;
                        local_e8.h = 1;
                        local_e8.d = 1;
                        local_e8.dims = local_e8.elempack;
                        local_e8.c = local_e8.elempack;
                        Mat::operator=(&pBVar3[iVar4].shape,&local_e8);
                        goto LAB_0015000b;
                      }
                    }
                    piVar8 = piVar8 + 4;
                  }
                }
                pvVar1 = &local_100->bottom_shapes;
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                          (pvVar1,(long)bottom_count);
                lVar10 = 0;
                for (lVar9 = 0; lVar9 < bottom_count; lVar9 = lVar9 + 1) {
                  Mat::operator=((Mat *)((long)&((pvVar1->
                                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->data +
                                        lVar10),
                                 &(this->d->blobs).
                                  super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                  _M_impl.super__Vector_impl_data._M_start
                                  [(local_90->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                   .super__Vector_impl_data._M_start[lVar9]].shape);
                  lVar10 = lVar10 + 0x48;
                }
                pvVar1 = &local_100->top_shapes;
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(pvVar1,(long)top_count);
                lVar10 = 0;
                for (lVar9 = 0; pLVar5 = local_100, lVar9 < top_count; lVar9 = lVar9 + 1) {
                  Mat::operator=((Mat *)((long)&((pvVar1->
                                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->data +
                                        lVar10),
                                 &(this->d->blobs).
                                  super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                  _M_impl.super__Vector_impl_data._M_start
                                  [(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start[lVar9]].shape);
                  lVar10 = lVar10 + 0x48;
                }
                iVar4 = (*local_100->_vptr_Layer[2])(local_100,&pd);
                uVar7 = local_f0;
                if (iVar4 == 0) {
                  (this->d->layers).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start[local_f0] = pLVar5;
                }
                else {
                  fprintf(_stderr,"layer load_param %d %s failed",local_f0 & 0xffffffff,
                          (pLVar5->name)._M_dataplus._M_p);
                  fputc(10,_stderr);
                }
                Mat::~Mat(&shape_hints);
              }
              else {
                fprintf(_stderr,"ParamDict load_param %d %s failed",local_f0 & 0xffffffff,
                        (local_100->name)._M_dataplus._M_p);
                fputc(10,_stderr);
              }
              uVar7 = uVar7 + 1;
            } while( true );
          }
          pcVar6 = "invalid layer_count or blob_count";
          sStack_120 = 0x21;
        }
        else {
          pcVar6 = "read blob_count failed";
          sStack_120 = 0x16;
        }
      }
      else {
        pcVar6 = "read layer_count failed";
        sStack_120 = 0x17;
      }
    }
    else {
      pcVar6 = "param is too old, please regenerate";
      sStack_120 = 0x23;
    }
  }
  else {
    pcVar6 = "read magic failed";
    sStack_120 = 0x11;
  }
  fwrite(pcVar6,sStack_120,1,_stderr);
  fputc(10,_stderr);
  return -1;
}

Assistant:

int Net::load_param_bin(const DataReader& dr)
{
#define READ_VALUE(buf)                            \
    if (dr.read(&buf, sizeof(buf)) != sizeof(buf)) \
    {                                              \
        NCNN_LOGE("read " #buf " failed");         \
        return -1;                                 \
    }

    int magic = 0;
    READ_VALUE(magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    int layer_count = 0;
    int blob_count = 0;
    READ_VALUE(layer_count)
    READ_VALUE(blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    d->layers.resize(layer_count);
    d->blobs.resize(blob_count);

#if NCNN_VULKAN
    // TODO enable gpu when bf16 conversion implemented
    if (opt.use_bf16_storage)
        opt.use_vulkan_compute = false;

    if (opt.use_vulkan_compute)
    {
        if (!d->vkdev) d->vkdev = get_gpu_device();
        if (!d->vkdev) opt.use_vulkan_compute = false; // no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!d->vkdev->info.support_fp16_packed()) opt.use_fp16_packed = false;
        if (!d->vkdev->info.support_fp16_storage()) opt.use_fp16_storage = false;
        if (!d->vkdev->info.support_fp16_arithmetic()) opt.use_fp16_arithmetic = false;
        if (!d->vkdev->info.support_int8_storage()) opt.use_int8_storage = false;
        if (!d->vkdev->info.support_int8_arithmetic()) opt.use_int8_arithmetic = false;

        if (d->vkdev->info.bug_buffer_image_load_zero()) opt.use_image_storage = false;

        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_packed && !opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
    else
    {
        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    for (int i = 0; i < layer_count; i++)
    {
        int typeindex;
        int bottom_count;
        int top_count;
        READ_VALUE(typeindex)
        READ_VALUE(bottom_count)
        READ_VALUE(top_count)

        Layer* layer = create_layer(typeindex);
        if (!layer)
        {
            int custom_index = typeindex & ~LayerType::CustomBit;
            layer = create_custom_layer(custom_index);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %d not exists or registered", typeindex);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = d->vkdev;
#endif // NCNN_VULKAN

        //         layer->type = std::string(layer_type);
        //         layer->name = std::string(layer_name);
        //         NCNN_LOGE("new layer %d", typeindex);

        layer->bottoms.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            int bottom_blob_index;
            READ_VALUE(bottom_blob_index)

            Blob& blob = d->blobs[bottom_blob_index];

            blob.consumer = i;

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            int top_blob_index;
            READ_VALUE(top_blob_index)

            Blob& blob = d->blobs[top_blob_index];

            //             blob.name = std::string(blob_name);
            //             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = top_blob_index;
        }

        // layer specific params
        int pdlr = pd.load_param_bin(dr);
        if (pdlr != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("ParamDict load_param %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("ParamDict load_param %d failed", i);
#endif
            continue;
        }

        if (layer->support_int8_storage)
        {
            // no int8 gpu support yet
            opt.use_vulkan_compute = false;
        }

        // pull out top blob shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j = 0; j < top_count; j++)
            {
                Blob& blob = d->blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            layer->bottom_shapes[j] = d->blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            layer->top_shapes[j] = d->blobs[layer->tops[j]].shape;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("layer load_param %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("layer load_param %d failed", i);
#endif
            continue;
        }

        d->layers[i] = layer;
    }

    d->update_input_output_indexes();

#undef READ_VALUE
    return 0;
}